

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O2

Vector3f __thiscall
pbrt::PortalImageInfiniteLight::RenderFromImage
          (PortalImageInfiniteLight *this,Point2f uv,Float *duv_dw)

{
  float fVar1;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar3;
  undefined1 in_register_00001208 [56];
  undefined1 auVar2 [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Vector3<float> v;
  Tuple3<pbrt::Vector3,_float> TVar6;
  float local_38;
  Vector3<float> local_1c;
  
  auVar2._8_56_ = in_register_00001208;
  auVar2._0_8_ = uv.super_Tuple2<pbrt::Point2,_float>;
  auVar4 = vmovshdup_avx(auVar2._0_16_);
  auVar4 = vfmadd213ss_fma(auVar4,SUB6416(ZEXT464(0x40490fdb),0),SUB6416(ZEXT464(0xbfc90fdb),0));
  auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40490fdb),0),auVar2._0_16_,
                           SUB6416(ZEXT464(0xbfc90fdb),0));
  fVar1 = tanf(auVar5._0_4_);
  local_38 = auVar4._0_4_;
  local_1c.super_Tuple3<pbrt::Vector3,_float>.y = tanf(local_38);
  local_1c.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  uVar3 = extraout_XMM0_Qb;
  local_1c.super_Tuple3<pbrt::Vector3,_float>.x = fVar1;
  v = Normalize<float>(&local_1c);
  if (duv_dw != (Float *)0x0) {
    auVar5._8_4_ = 0x3f800000;
    auVar5._0_8_ = 0x3f8000003f800000;
    auVar5._12_4_ = 0x3f800000;
    auVar4._0_4_ = v.super_Tuple3<pbrt::Vector3,_float>.x * v.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar4._4_4_ = v.super_Tuple3<pbrt::Vector3,_float>.y * v.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar4._8_4_ = (float)uVar3 * (float)uVar3;
    fVar1 = (float)((ulong)uVar3 >> 0x20);
    auVar4._12_4_ = fVar1 * fVar1;
    auVar5 = vsubps_avx(auVar5,auVar4);
    auVar4 = vmovshdup_avx(auVar5);
    *duv_dw = (auVar4._0_4_ * auVar5._0_4_ * 9.869605) / v.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  TVar6 = (Tuple3<pbrt::Vector3,_float>)
          Frame::FromLocal(&this->portalFrame,v.super_Tuple3<pbrt::Vector3,_float>);
  return (Vector3f)TVar6;
}

Assistant:

PBRT_CPU_GPU
    Vector3f RenderFromImage(Point2f uv, Float *duv_dw = nullptr) const {
        Float alpha = -Pi / 2 + uv[0] * Pi, beta = -Pi / 2 + uv[1] * Pi;
        Float x = std::tan(alpha), y = std::tan(beta);
        DCHECK(!IsInf(x) && !IsInf(y));
        Vector3f w = Normalize(Vector3f(x, y, 1));
        // Compute Jacobian determinant of mapping $\roman{d}(u,v)/\roman{d}\omega$ if
        // needed
        if (duv_dw)
            *duv_dw = Sqr(Pi) * (1 - Sqr(w.x)) * (1 - Sqr(w.y)) / w.z;

        return portalFrame.FromLocal(w);
    }